

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O0

size_type __thiscall
lf::mesh::hybrid2d::MeshFactory::AddEntity
          (MeshFactory *this,RefEl ref_el,span<const_unsigned_int,_18446744073709551615UL> *nodes,
          unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry
          )

{
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *puVar1;
  bool bVar2;
  RefElType RVar3;
  RefElType RVar4;
  dim_t dVar5;
  dim_t dVar6;
  int iVar7;
  uint uVar8;
  size_type sVar9;
  pointer pGVar10;
  reference pvVar11;
  ostream *poVar12;
  size_type sVar13;
  reference pvVar14;
  allocator<char> local_1909;
  string local_1908;
  allocator<char> local_18e1;
  string local_18e0;
  allocator<char> local_18b9;
  string local_18b8;
  string local_1898;
  allocator<char> local_1871;
  string local_1870;
  allocator<char> local_1849;
  string local_1848;
  stringstream local_1828 [8];
  stringstream ss_9;
  ostream local_1818 [383];
  allocator<char> local_1699;
  string local_1698;
  allocator<char> local_1671;
  string local_1670;
  allocator<char> local_1649;
  string local_1648;
  string local_1628;
  allocator<char> local_1601;
  string local_1600;
  allocator<char> local_15d9;
  string local_15d8;
  string local_15b8;
  stringstream local_1598 [8];
  stringstream ss_8;
  ostream local_1588 [383];
  allocator<char> local_1409;
  string local_1408;
  allocator<char> local_13e1;
  string local_13e0;
  allocator<char> local_13b9;
  string local_13b8;
  string local_1398;
  allocator<char> local_1371;
  string local_1370;
  allocator<char> local_1349;
  string local_1348;
  stringstream local_1328 [8];
  stringstream ss_7;
  ostream local_1318 [376];
  uint *local_11a0;
  uint *n_1;
  iterator __end2;
  iterator __begin2;
  span<const_unsigned_int,_18446744073709551615UL> *__range2;
  uchar count;
  array<unsigned_int,_4UL> ns;
  allocator<char> local_1141;
  string local_1140;
  allocator<char> local_1119;
  string local_1118;
  string local_10f8;
  allocator<char> local_10d1;
  string local_10d0;
  allocator<char> local_10a9;
  string local_10a8;
  stringstream local_1088 [8];
  stringstream ss_6;
  ostream local_1078 [383];
  allocator<char> local_ef9;
  string local_ef8;
  allocator<char> local_ed1;
  string local_ed0;
  allocator<char> local_ea9;
  string local_ea8;
  string local_e88;
  allocator<char> local_e61;
  string local_e60;
  allocator<char> local_e39;
  string local_e38;
  stringstream local_e18 [8];
  stringstream ss_5;
  ostream local_e08 [383];
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  stringstream local_ba8 [8];
  stringstream ss_4;
  ostream local_b98 [376];
  uint *local_a20;
  uint *n;
  iterator __end3;
  iterator __begin3;
  span<const_unsigned_int,_18446744073709551615UL> *__range3;
  uchar count_1;
  array<unsigned_int,_2UL> ns_1;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  string local_980;
  allocator<char> local_959;
  string local_958;
  allocator<char> local_931;
  string local_930;
  stringstream local_910 [8];
  stringstream ss_3;
  ostream local_900 [382];
  RefEl local_782;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  stringstream local_6a0 [8];
  stringstream ss_2;
  ostream local_690 [383];
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [383];
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *local_28;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry_local;
  span<const_unsigned_int,_18446744073709551615UL> *nodes_local;
  MeshFactory *this_local;
  RefEl ref_el_local;
  
  local_28 = geometry;
  geometry_local =
       (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)nodes;
  nodes_local = (span<const_unsigned_int,_18446744073709551615UL> *)this;
  this_local._3_1_ = ref_el.type_;
  dVar5 = lf::base::RefEl::Dimension((RefEl *)((long)&this_local + 3));
  if (dVar5 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"Use AddPoint() to add a node to a mesh.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"ref_el.Dimension() > 0",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0x31,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0x31,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  dVar5 = lf::base::RefEl::Dimension((RefEl *)((long)&this_local + 3));
  if (2 < dVar5) {
    std::__cxx11::stringstream::stringstream(local_430);
    std::operator<<(local_420,"ref_el.Dimension > 2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"ref_el.Dimension() <= 2",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_479);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_450,&local_478,0x32,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"",&local_511);
    lf::base::AssertionFailed(&local_4c0,&local_4e8,0x32,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    abort();
  }
  bVar2 = std::operator==(local_28,(nullptr_t)0x0);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pGVar10 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
              ::operator->(local_28);
    dVar6 = (*pGVar10->_vptr_Geometry[1])();
    if (dVar6 != this->dim_world_) {
      std::__cxx11::stringstream::stringstream(local_6a0);
      std::operator<<(local_690,"geometry->DimGlobal() != dim_world_");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0,"geometry->DimGlobal() == dim_world_",&local_6c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_6e9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_6c0,&local_6e8,0x35,&local_710);
      std::__cxx11::string::~string((string *)&local_710);
      std::__cxx11::string::~string((string *)&local_6e8);
      std::allocator<char>::~allocator(&local_6e9);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::allocator<char>::~allocator(&local_6c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"false",&local_731);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_758,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_759);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"",&local_781);
      lf::base::AssertionFailed(&local_730,&local_758,0x35,&local_780);
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
      std::__cxx11::string::~string((string *)&local_758);
      std::allocator<char>::~allocator(&local_759);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      abort();
    }
    pGVar10 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
              ::operator->(local_28);
    iVar7 = (*pGVar10->_vptr_Geometry[2])();
    local_782.type_ = (RefElType)iVar7;
    RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_782);
    RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 3));
    if (RVar3 != RVar4) {
      std::__cxx11::stringstream::stringstream(local_910);
      std::operator<<(local_900,"ref_el != geometry->RefEl()");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_930,"geometry->RefEl() == ref_el",&local_931);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_958,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_959);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_930,&local_958,0x36,&local_980);
      std::__cxx11::string::~string((string *)&local_980);
      std::__cxx11::string::~string((string *)&local_958);
      std::allocator<char>::~allocator(&local_959);
      std::__cxx11::string::~string((string *)&local_930);
      std::allocator<char>::~allocator(&local_931);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"false",&local_9a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_9c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(ns_1._M_elems + 1),"",(allocator<char> *)((long)ns_1._M_elems + 3));
      lf::base::AssertionFailed(&local_9a0,&local_9c8,0x36,(string *)(ns_1._M_elems + 1));
      std::__cxx11::string::~string((string *)(ns_1._M_elems + 1));
      std::allocator<char>::~allocator((allocator<char> *)((long)ns_1._M_elems + 3));
      std::__cxx11::string::~string((string *)&local_9c8);
      std::allocator<char>::~allocator(&local_9c9);
      std::__cxx11::string::~string((string *)&local_9a0);
      std::allocator<char>::~allocator(&local_9a1);
      abort();
    }
  }
  RVar3 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 3));
  ns_1._M_elems[0]._2_1_ = lf::base::RefEl::kSegment();
  RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)ns_1._M_elems + 2));
  if (RVar3 == RVar4) {
    memset((void *)((long)&__range3 + 4),0,8);
    puVar1 = geometry_local;
    __range3._3_1_ = 0;
    __end3 = std::span<const_unsigned_int,_18446744073709551615UL>::begin
                       ((span<const_unsigned_int,_18446744073709551615UL> *)geometry_local);
    n = (uint *)std::span<const_unsigned_int,_18446744073709551615UL>::end
                          ((span<const_unsigned_int,_18446744073709551615UL> *)puVar1);
    while (bVar2 = __gnu_cxx::
                   operator==<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                                       *)&n), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_a20 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                  ::operator*(&__end3);
      uVar8 = *local_a20;
      sVar13 = std::
               vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
               ::size(&this->nodes_);
      if (sVar13 <= uVar8) {
        std::__cxx11::stringstream::stringstream(local_ba8);
        poVar12 = std::operator<<(local_b98,"node ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,*local_a20);
        std::operator<<(poVar12,
                        " specified in call to AddEntity must be inserted with AddPoint() first.");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bc8,"n < nodes_.size()",&local_bc9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bf0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_bf1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_bc8,&local_bf0,0x41,&local_c18);
        std::__cxx11::string::~string((string *)&local_c18);
        std::__cxx11::string::~string((string *)&local_bf0);
        std::allocator<char>::~allocator(&local_bf1);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::allocator<char>::~allocator(&local_bc9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c38,"false",&local_c39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c60,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_c61);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"",&local_c89);
        lf::base::AssertionFailed(&local_c38,&local_c60,0x41,&local_c88);
        std::__cxx11::string::~string((string *)&local_c88);
        std::allocator<char>::~allocator(&local_c89);
        std::__cxx11::string::~string((string *)&local_c60);
        std::allocator<char>::~allocator(&local_c61);
        std::__cxx11::string::~string((string *)&local_c38);
        std::allocator<char>::~allocator(&local_c39);
        abort();
      }
      if (1 < __range3._3_1_) {
        std::__cxx11::stringstream::stringstream(local_e18);
        std::operator<<(local_e08,"ref_el = segment, but nodes contains more than 2 node indices");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e38,"count < 2",&local_e39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e60,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_e61);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_e38,&local_e60,0x44,&local_e88);
        std::__cxx11::string::~string((string *)&local_e88);
        std::__cxx11::string::~string((string *)&local_e60);
        std::allocator<char>::~allocator(&local_e61);
        std::__cxx11::string::~string((string *)&local_e38);
        std::allocator<char>::~allocator(&local_e39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ea8,"false",&local_ea9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ed0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_ed1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ef8,"",&local_ef9);
        lf::base::AssertionFailed(&local_ea8,&local_ed0,0x44,&local_ef8);
        std::__cxx11::string::~string((string *)&local_ef8);
        std::allocator<char>::~allocator(&local_ef9);
        std::__cxx11::string::~string((string *)&local_ed0);
        std::allocator<char>::~allocator(&local_ed1);
        std::__cxx11::string::~string((string *)&local_ea8);
        std::allocator<char>::~allocator(&local_ea9);
        abort();
      }
      uVar8 = *local_a20;
      pvVar11 = std::array<unsigned_int,_2UL>::operator[]
                          ((array<unsigned_int,_2UL> *)((long)&__range3 + 4),(ulong)__range3._3_1_);
      *pvVar11 = uVar8;
      __range3._3_1_ = __range3._3_1_ + 1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    if (__range3._3_1_ != 2) {
      std::__cxx11::stringstream::stringstream(local_1088);
      poVar12 = std::operator<<(local_1078,"ref_el = segment but size of nodes was ");
      std::operator<<(poVar12,__range3._3_1_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10a8,"count == 2",&local_10a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_10d1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_10a8,&local_10d0,0x49,&local_10f8);
      std::__cxx11::string::~string((string *)&local_10f8);
      std::__cxx11::string::~string((string *)&local_10d0);
      std::allocator<char>::~allocator(&local_10d1);
      std::__cxx11::string::~string((string *)&local_10a8);
      std::allocator<char>::~allocator(&local_10a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1118,"false",&local_1119);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1140,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_1141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(ns._M_elems + 3),"",(allocator<char> *)((long)ns._M_elems + 0xb));
      lf::base::AssertionFailed(&local_1118,&local_1140,0x49,(string *)(ns._M_elems + 3));
      std::__cxx11::string::~string((string *)(ns._M_elems + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)ns._M_elems + 0xb));
      std::__cxx11::string::~string((string *)&local_1140);
      std::allocator<char>::~allocator(&local_1141);
      std::__cxx11::string::~string((string *)&local_1118);
      std::allocator<char>::~allocator(&local_1119);
      abort();
    }
    std::
    vector<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
    ::
    emplace_back<std::array<unsigned_int,2ul>&,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
              ((vector<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,2ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
                *)&this->edges_,(array<unsigned_int,_2UL> *)((long)&__range3 + 4),local_28);
    sVar13 = std::
             vector<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
             ::size(&this->edges_);
    iVar7 = (int)sVar13;
  }
  else {
    memset((void *)((long)&__range2 + 4),0,0x10);
    puVar1 = geometry_local;
    __range2._3_1_ = 0;
    __end2 = std::span<const_unsigned_int,_18446744073709551615UL>::begin
                       ((span<const_unsigned_int,_18446744073709551615UL> *)geometry_local);
    n_1 = (uint *)std::span<const_unsigned_int,_18446744073709551615UL>::end
                            ((span<const_unsigned_int,_18446744073709551615UL> *)puVar1);
    while (bVar2 = __gnu_cxx::
                   operator==<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                             (&__end2,(__normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                                       *)&n_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_11a0 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
                   ::operator*(&__end2);
      uVar8 = (uint)__range2._3_1_;
      sVar9 = lf::base::RefEl::NumNodes((RefEl *)((long)&this_local + 3));
      if (sVar9 <= uVar8) {
        std::__cxx11::stringstream::stringstream(local_1328);
        poVar12 = std::operator<<(local_1318,"ref_el = ");
        poVar12 = lf::base::operator<<(poVar12,(RefEl *)((long)&this_local + 3));
        poVar12 = std::operator<<(poVar12,", but nodes contains ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,__range2._3_1_ + 1);
        std::operator<<(poVar12,"node indices");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1348,"count < ref_el.NumNodes()",&local_1349);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1370,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_1371);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_1348,&local_1370,0x55,&local_1398);
        std::__cxx11::string::~string((string *)&local_1398);
        std::__cxx11::string::~string((string *)&local_1370);
        std::allocator<char>::~allocator(&local_1371);
        std::__cxx11::string::~string((string *)&local_1348);
        std::allocator<char>::~allocator(&local_1349);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13b8,"false",&local_13b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_13e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1408,"",&local_1409);
        lf::base::AssertionFailed(&local_13b8,&local_13e0,0x55,&local_1408);
        std::__cxx11::string::~string((string *)&local_1408);
        std::allocator<char>::~allocator(&local_1409);
        std::__cxx11::string::~string((string *)&local_13e0);
        std::allocator<char>::~allocator(&local_13e1);
        std::__cxx11::string::~string((string *)&local_13b8);
        std::allocator<char>::~allocator(&local_13b9);
        abort();
      }
      uVar8 = *local_11a0;
      sVar13 = std::
               vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
               ::size(&this->nodes_);
      if (sVar13 <= uVar8) {
        std::__cxx11::stringstream::stringstream(local_1598);
        poVar12 = std::operator<<(local_1588," Node ");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,*local_11a0);
        poVar12 = std::operator<<(poVar12," for ");
        lf::base::RefEl::ToString_abi_cxx11_(&local_15b8,(RefEl *)((long)&this_local + 3));
        poVar12 = std::operator<<(poVar12,(string *)&local_15b8);
        std::operator<<(poVar12,"  must be inserted with AddNode() first.");
        std::__cxx11::string::~string((string *)&local_15b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15d8,"n < nodes_.size()",&local_15d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1600,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_1601);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_15d8,&local_1600,0x58,&local_1628);
        std::__cxx11::string::~string((string *)&local_1628);
        std::__cxx11::string::~string((string *)&local_1600);
        std::allocator<char>::~allocator(&local_1601);
        std::__cxx11::string::~string((string *)&local_15d8);
        std::allocator<char>::~allocator(&local_15d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1648,"false",&local_1649);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1670,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                   ,&local_1671);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1698,"",&local_1699);
        lf::base::AssertionFailed(&local_1648,&local_1670,0x58,&local_1698);
        std::__cxx11::string::~string((string *)&local_1698);
        std::allocator<char>::~allocator(&local_1699);
        std::__cxx11::string::~string((string *)&local_1670);
        std::allocator<char>::~allocator(&local_1671);
        std::__cxx11::string::~string((string *)&local_1648);
        std::allocator<char>::~allocator(&local_1649);
        abort();
      }
      uVar8 = *local_11a0;
      pvVar14 = std::array<unsigned_int,_4UL>::operator[]
                          ((array<unsigned_int,_4UL> *)((long)&__range2 + 4),(ulong)__range2._3_1_);
      *pvVar14 = uVar8;
      __range2._3_1_ = __range2._3_1_ + 1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::span<const_unsigned_int,_18446744073709551615UL>_>
      ::operator++(&__end2);
    }
    uVar8 = (uint)__range2._3_1_;
    sVar9 = lf::base::RefEl::NumNodes((RefEl *)((long)&this_local + 3));
    if (uVar8 != sVar9) {
      std::__cxx11::stringstream::stringstream(local_1828);
      poVar12 = std::operator<<(local_1818,"ref_el.NumNodes() = ");
      sVar9 = lf::base::RefEl::NumNodes((RefEl *)((long)&this_local + 3));
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar9);
      poVar12 = std::operator<<(poVar12,", but argument nodes contained ");
      poVar12 = std::operator<<(poVar12,__range2._3_1_);
      std::operator<<(poVar12," nodes");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1848,"count == ref_el.NumNodes()",&local_1849);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1870,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_1871);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1848,&local_1870,0x5f,&local_1898);
      std::__cxx11::string::~string((string *)&local_1898);
      std::__cxx11::string::~string((string *)&local_1870);
      std::allocator<char>::~allocator(&local_1871);
      std::__cxx11::string::~string((string *)&local_1848);
      std::allocator<char>::~allocator(&local_1849);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_18b8,"false",&local_18b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_18e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
                 ,&local_18e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1908,"",&local_1909);
      lf::base::AssertionFailed(&local_18b8,&local_18e0,0x5f,&local_1908);
      std::__cxx11::string::~string((string *)&local_1908);
      std::allocator<char>::~allocator(&local_1909);
      std::__cxx11::string::~string((string *)&local_18e0);
      std::allocator<char>::~allocator(&local_18e1);
      std::__cxx11::string::~string((string *)&local_18b8);
      std::allocator<char>::~allocator(&local_18b9);
      abort();
    }
    if (__range2._3_1_ == 3) {
      pvVar14 = std::array<unsigned_int,_4UL>::operator[]
                          ((array<unsigned_int,_4UL> *)((long)&__range2 + 4),3);
      *pvVar14 = 0xffffffff;
    }
    std::
    vector<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
    ::
    emplace_back<std::array<unsigned_int,4ul>&,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
              ((vector<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>,std::allocator<std::pair<std::array<unsigned_int,4ul>,std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>>
                *)&this->elements_,(array<unsigned_int,_4UL> *)((long)&__range2 + 4),local_28);
    sVar13 = std::
             vector<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
             ::size(&this->elements_);
    iVar7 = (int)sVar13;
  }
  this_local._4_4_ = iVar7 - 1;
  return this_local._4_4_;
}

Assistant:

MeshFactory::size_type MeshFactory::AddEntity(
    base::RefEl ref_el, const std::span<const size_type>& nodes,
    std::unique_ptr<geometry::Geometry>&& geometry) {
  LF_ASSERT_MSG(ref_el.Dimension() > 0,
                "Use AddPoint() to add a node to a mesh.");
  LF_ASSERT_MSG(ref_el.Dimension() <= 2, "ref_el.Dimension > 2");
  if (geometry != nullptr) {
    LF_ASSERT_MSG(geometry->DimGlobal() == dim_world_,
                  "geometry->DimGlobal() != dim_world_");
    LF_ASSERT_MSG(geometry->RefEl() == ref_el, "ref_el != geometry->RefEl()");
  }

  // Add an edge
  if (ref_el == base::RefEl::kSegment()) {
    std::array<size_type, 2> ns{};
    unsigned char count = 0;
    for (const auto& n : nodes) {
      LF_ASSERT_MSG(n < nodes_.size(),
                    "node " << n
                            << " specified in call to AddEntity must be "
                               "inserted with AddPoint() first.");
      LF_ASSERT_MSG(
          count < 2,
          "ref_el = segment, but nodes contains more than 2 node indices");
      ns[count] = n;
      ++count;
    }
    LF_ASSERT_MSG(count == 2,
                  "ref_el = segment but size of nodes was " << count);
    edges_.emplace_back(ns, std::move(geometry));
    return edges_.size() - 1;
  }  // end insertion of an edge

  // otherwise its an element:
  // LF_ASSERT_MSG(geometry, "Geometry is required for elements (codim=0)");
  std::array<size_type, 4> ns{};
  unsigned char count = 0;
  for (const auto& n : nodes) {
    LF_ASSERT_MSG(count < ref_el.NumNodes(),
                  "ref_el = " << ref_el << ", but nodes contains " << count + 1
                              << "node indices");
    LF_ASSERT_MSG(n < nodes_.size(),
                  " Node " << n << " for " << ref_el.ToString()
                           << "  must be inserted with AddNode() first.");
    ns[count] = n;
    ++count;
  }
  LF_ASSERT_MSG(count == ref_el.NumNodes(),
                "ref_el.NumNodes() = " << ref_el.NumNodes()
                                       << ", but argument nodes contained "
                                       << count << " nodes");

  // if we have added a triangle, set the fourth node to -1.
  if (count == 3) {
    ns[3] = -1;
  }
  elements_.emplace_back(ns, std::move(geometry));
  return elements_.size() - 1;
}